

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O2

ssize_t __thiscall
sc_core::vcd_signed_int_trace::write(vcd_signed_int_trace *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  char rawdata [1000];
  char compdata [1000];
  
  uVar2 = *this->object;
  bVar1 = (byte)this->rem_bits;
  uVar3 = (this->super_vcd_trace).bit_width;
  if ((int)(uVar2 << (bVar1 & 0x1f)) >> (bVar1 & 0x1f) == uVar2) {
    uVar6 = 1 << ((char)uVar3 - 1U & 0x1f);
    uVar5 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      rawdata[uVar5] = (uVar2 & uVar6) == 0 ^ 0x31;
      uVar6 = uVar6 >> 1;
    }
  }
  else {
    uVar5 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      rawdata[uVar5] = 'x';
    }
  }
  rawdata[uVar4] = '\0';
  vcd_trace::compose_data_line(&this->super_vcd_trace,rawdata,compdata);
  fputs(compdata,(FILE *)CONCAT44(in_register_00000034,__fd));
  uVar2 = *this->object;
  this->old_value = uVar2;
  return (ulong)uVar2;
}

Assistant:

void vcd_signed_int_trace::write(FILE* f)
{
    char rawdata[1000];
    char compdata[1000];
    int bitindex;

    // Check for overflow
    if (((object << rem_bits) >> rem_bits) != object) {
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            rawdata[bitindex] = 'x';
        }
    }
    else {
        unsigned bit_mask = 1 << (bit_width-1);
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            rawdata[bitindex] = (object & bit_mask)? '1' : '0';
            bit_mask = bit_mask >> 1;
        }
    }
    rawdata[bitindex] = '\0';
    compose_data_line(rawdata, compdata);
    std::fputs(compdata, f);
    old_value = object;
}